

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiVertexInputBinding *b)

{
  long lVar1;
  QDebug *pQVar2;
  uint *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)b);
  *(undefined1 *)(*(long *)b + 0x30) = 0;
  pQVar2 = QDebug::operator<<((QDebug *)b,"QRhiVertexInputBinding(stride=");
  pQVar2 = QDebug::operator<<(pQVar2,*in_RDX);
  pQVar2 = QDebug::operator<<(pQVar2," cls=");
  pQVar2 = QDebug::operator<<(pQVar2,in_RDX[1]);
  pQVar2 = QDebug::operator<<(pQVar2," step-rate=");
  pQVar2 = QDebug::operator<<(pQVar2,in_RDX[2]);
  QDebug::operator<<(pQVar2,')');
  b->m_stride = 0;
  b->m_classification = PerVertex;
  *(undefined8 *)dbg.stream = *(undefined8 *)b;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputBinding &b)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputBinding(stride=" << b.stride()
                  << " cls=" << b.classification()
                  << " step-rate=" << b.instanceStepRate()
                  << ')';
    return dbg;
}